

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O3

Type __thiscall FIX::DataDictionary::XMLTypeToType(DataDictionary *this,string *type)

{
  int iVar1;
  Type TVar2;
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)&(this->m_beginString).super_StringField.super_FieldBase.m_string);
  if (((iVar1 < 0) && (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)) ||
     (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)) {
    TVar2 = String;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      TVar2 = Char;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        TVar2 = Price;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 == 0) {
          TVar2 = Int;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)type);
          if (iVar1 == 0) {
            TVar2 = Amt;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)type);
            if (iVar1 == 0) {
              TVar2 = Qty;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)type);
              if (iVar1 == 0) {
                TVar2 = Currency;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)type);
                if (iVar1 == 0) {
                  TVar2 = MultipleValueString;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)type);
                  if (iVar1 == 0) {
                    TVar2 = MultipleStringValue;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)type);
                    if (iVar1 == 0) {
                      TVar2 = MultipleCharValue;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)type);
                      if (iVar1 == 0) {
                        TVar2 = Exchange;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)type);
                        if (iVar1 == 0) {
                          TVar2 = UtcTimeStamp;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)type);
                          if (iVar1 == 0) {
                            TVar2 = Boolean;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)type);
                            if (iVar1 == 0) {
                              TVar2 = LocalMktDate;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)type);
                              if (iVar1 == 0) {
                                TVar2 = Data;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)type);
                                if (iVar1 == 0) {
                                  TVar2 = Float;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)type);
                                  if (iVar1 == 0) {
                                    TVar2 = PriceOffset;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)type);
                                    if (iVar1 == 0) {
                                      TVar2 = MonthYear;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)type);
                                      if (iVar1 == 0) {
                                        TVar2 = DayOfMonth;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)type);
                                        TVar2 = UtcDate;
                                        if ((iVar1 != 0) &&
                                           (iVar1 = std::__cxx11::string::compare((char *)type),
                                           iVar1 != 0)) {
                                          iVar1 = std::__cxx11::string::compare((char *)type);
                                          if (iVar1 == 0) {
                                            TVar2 = UtcTimeOnly;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)type);
                                            if (iVar1 == 0) {
                                              TVar2 = NumInGroup;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)type);
                                              if (iVar1 == 0) {
                                                TVar2 = Percentage;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare((char *)type);
                                                if (iVar1 == 0) {
                                                  TVar2 = SeqNum;
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)type);
                                                  if (iVar1 == 0) {
                                                    TVar2 = Length;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)type);
                                                    if (iVar1 == 0) {
                                                      TVar2 = Country;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)type);
                                                      TVar2 = UtcTimeStamp;
                                                      if (iVar1 != 0) {
                                                        TVar2 = Unknown;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TYPE::Type DataDictionary::XMLTypeToType(const std::string &type) const {
  if (m_beginString < "FIX.4.2" && type == "CHAR") {
    return TYPE::String;
  }

  if (type == "STRING") {
    return TYPE::String;
  }
  if (type == "CHAR") {
    return TYPE::Char;
  }
  if (type == "PRICE") {
    return TYPE::Price;
  }
  if (type == "INT") {
    return TYPE::Int;
  }
  if (type == "AMT") {
    return TYPE::Amt;
  }
  if (type == "QTY") {
    return TYPE::Qty;
  }
  if (type == "CURRENCY") {
    return TYPE::Currency;
  }
  if (type == "MULTIPLEVALUESTRING") {
    return TYPE::MultipleValueString;
  }
  if (type == "MULTIPLESTRINGVALUE") {
    return TYPE::MultipleStringValue;
  }
  if (type == "MULTIPLECHARVALUE") {
    return TYPE::MultipleCharValue;
  }
  if (type == "EXCHANGE") {
    return TYPE::Exchange;
  }
  if (type == "UTCTIMESTAMP") {
    return TYPE::UtcTimeStamp;
  }
  if (type == "BOOLEAN") {
    return TYPE::Boolean;
  }
  if (type == "LOCALMKTDATE") {
    return TYPE::LocalMktDate;
  }
  if (type == "DATA") {
    return TYPE::Data;
  }
  if (type == "FLOAT") {
    return TYPE::Float;
  }
  if (type == "PRICEOFFSET") {
    return TYPE::PriceOffset;
  }
  if (type == "MONTHYEAR") {
    return TYPE::MonthYear;
  }
  if (type == "DAYOFMONTH") {
    return TYPE::DayOfMonth;
  }
  if (type == "UTCDATE") {
    return TYPE::UtcDate;
  }
  if (type == "UTCDATEONLY") {
    return TYPE::UtcDateOnly;
  }
  if (type == "UTCTIMEONLY") {
    return TYPE::UtcTimeOnly;
  }
  if (type == "NUMINGROUP") {
    return TYPE::NumInGroup;
  }
  if (type == "PERCENTAGE") {
    return TYPE::Percentage;
  }
  if (type == "SEQNUM") {
    return TYPE::SeqNum;
  }
  if (type == "LENGTH") {
    return TYPE::Length;
  }
  if (type == "COUNTRY") {
    return TYPE::Country;
  }
  if (type == "TIME") {
    return TYPE::UtcTimeStamp;
  }
  return TYPE::Unknown;
}